

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O0

double __thiscall
trento::NucleonCommon::thickness(NucleonCommon *this,NucleonData *nucleon,double x,double y)

{
  bool bVar1;
  long in_RSI;
  FastExp<double> *in_RDI;
  double in_XMM0_Qa;
  double x_00;
  undefined1 auVar2 [64];
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double distance_sq;
  double fluct;
  Constituent *constituent;
  const_iterator __end1;
  const_iterator __begin1;
  vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  *__range1;
  double t;
  vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  *in_stack_ffffffffffffff80;
  double local_68;
  double local_60;
  double local_58;
  __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  *local_50;
  reference local_48;
  Constituent *local_40;
  __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  local_38;
  long local_30;
  double local_28;
  double local_20;
  double local_18;
  undefined1 extraout_var [56];
  
  local_28 = 0.0;
  local_30 = in_RSI + 0x20;
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_38._M_current =
       (Constituent *)
       std::
       vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>::
       begin(in_stack_ffffffffffffff78);
  local_40 = (Constituent *)
             std::
             vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
             ::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
               ::operator*(&local_38);
    local_50 = (__normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                *)local_48->fluctuation;
    local_60 = local_18 - local_48->x;
    x_00 = sqr<double>(&local_60);
    local_68 = local_20 - local_48->y;
    local_58 = sqr<double>(&local_68);
    local_58 = x_00 + local_58;
    if (local_58 < in_RDI[2].xmin_) {
      in_stack_ffffffffffffff80 = local_50;
      auVar2._0_8_ = FastExp<double>::operator()(in_RDI,x_00);
      auVar2._8_56_ = extraout_var;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_stack_ffffffffffffff80;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_28;
      auVar3 = vfmadd213sd_fma(auVar2._0_16_,auVar3,auVar4);
      local_28 = auVar3._0_8_;
    }
    __gnu_cxx::
    __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
    ::operator++(&local_38);
  }
  return in_RDI[2].dx_ * local_28;
}

Assistant:

inline double NucleonCommon::thickness(
    const NucleonData& nucleon, double x, double y) const {
  auto t = 0.;

  for (const auto& constituent : nucleon.constituents_) {
    auto fluct = constituent.fluctuation;
    auto distance_sq = sqr(x - constituent.x) + sqr(y - constituent.y);
    if (distance_sq < constituent_radius_sq_)
      t += fluct * fast_exp_(-.5*distance_sq/constituent_width_sq_);
  }

  return prefactor_ * t;
}